

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

BLOCK_SIZE find_partition_size(BLOCK_SIZE bsize,int rows_left,int cols_left,int *bh,int *bw)

{
  int int_size;
  int *bw_local;
  int *bh_local;
  int cols_left_local;
  int rows_left_local;
  BLOCK_SIZE bsize_local;
  BLOCK_SIZE local_1;
  
  int_size = (int)bsize;
  if ((rows_left < 1) || (cols_left < 1)) {
    local_1 = bsize;
    if (BLOCK_8X4 < bsize) {
      local_1 = BLOCK_8X8;
    }
  }
  else {
    for (; 0 < int_size; int_size = int_size + -3) {
      *bh = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [int_size];
      *bw = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [int_size];
      if ((*bh <= rows_left) && (*bw <= cols_left)) break;
    }
    local_1 = (BLOCK_SIZE)int_size;
  }
  return local_1;
}

Assistant:

static inline BLOCK_SIZE find_partition_size(BLOCK_SIZE bsize, int rows_left,
                                             int cols_left, int *bh, int *bw) {
  int int_size = (int)bsize;
  if (rows_left <= 0 || cols_left <= 0) {
    return AOMMIN(bsize, BLOCK_8X8);
  } else {
    for (; int_size > 0; int_size -= 3) {
      *bh = mi_size_high[int_size];
      *bw = mi_size_wide[int_size];
      if ((*bh <= rows_left) && (*bw <= cols_left)) {
        break;
      }
    }
  }
  return (BLOCK_SIZE)int_size;
}